

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

void __thiscall optimization::common_expr_del::BlockNodes::~BlockNodes(BlockNodes *this)

{
  vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
  *unaff_retaddr;
  
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)0x16cc8f);
  std::
  map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  ::~map((map<unsigned_int,_bool,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
          *)0x16cca0);
  std::
  map<optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::Node>,_std::allocator<std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>_>_>
  ::~map((map<optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::Node>,_std::allocator<std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>_>_>
          *)0x16ccae);
  std::
  map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
  ::~map((map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
          *)0x16ccbc);
  std::
  vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
  ::~vector(unaff_retaddr);
  return;
}

Assistant:

~BlockNodes() {}